

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageStringUp16(gdImagePtr im,gdFontPtr f,int x,int y,unsigned_short *s,int color)

{
  int iVar1;
  int local_30;
  int l;
  int i;
  int color_local;
  unsigned_short *s_local;
  int y_local;
  int x_local;
  gdFontPtr f_local;
  gdImagePtr im_local;
  
  iVar1 = strlen16(s);
  s_local._0_4_ = y;
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    gdImageCharUp(im,f,x,(int)s_local,(uint)s[local_30],color);
    s_local._0_4_ = (int)s_local - f->w;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageStringUp16 (gdImagePtr im, gdFontPtr f,
									 int x, int y, unsigned short *s, int color)
{
	int i;
	int l;
	l = strlen16 (s);
	for (i = 0; (i < l); i++) {
		gdImageCharUp (im, f, x, y, s[i], color);
		y -= f->w;
	}
}